

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlStaticCopyNode(xmlNodePtr node,xmlDocPtr doc,xmlNodePtr parent,int extended)

{
  xmlElementType xVar1;
  xmlNodePtr pxVar2;
  xmlDocPtr pxVar3;
  xmlNodePtr pxVar4;
  xmlChar *pxVar5;
  xmlRegisterNodeFunc *pp_Var6;
  xmlNsPtr pxVar7;
  xmlNs *pxVar8;
  xmlChar *pxVar9;
  xmlAttrPtr pxVar10;
  xmlEntityPtr pxVar11;
  xmlNodePtr pxVar12;
  int iVar13;
  _xmlNode **pp_Var14;
  xmlNodePtr parent_00;
  xmlNodePtr unaff_R13;
  xmlNodePtr pxVar15;
  _xmlNode *p_Var16;
  
  if (node == (xmlNodePtr)0x0) {
LAB_001854c1:
    return (xmlNodePtr)0x0;
  }
  switch(node->type) {
  case XML_ATTRIBUTE_NODE:
    pxVar4 = (xmlNodePtr)xmlCopyPropInternal(doc,parent,(xmlAttrPtr)node);
    return pxVar4;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    pxVar3 = xmlCopyDoc((xmlDocPtr)node,extended);
    return (xmlNodePtr)pxVar3;
  case XML_DOCUMENT_TYPE_NODE:
  case XML_NOTATION_NODE:
  case XML_DTD_NODE:
  case XML_ELEMENT_DECL:
  case XML_ATTRIBUTE_DECL:
  case XML_ENTITY_DECL:
    goto LAB_001854c1;
  case XML_NAMESPACE_DECL:
    pxVar4 = (xmlNodePtr)xmlCopyNamespaceList((xmlNsPtr)node);
    return pxVar4;
  }
  pxVar4 = (xmlNodePtr)(*xmlMalloc)(0x78);
  if (pxVar4 == (xmlNodePtr)0x0) {
    __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"copying node");
    return (xmlNodePtr)0x0;
  }
  pxVar4->nsDef = (xmlNs *)0x0;
  pxVar4->psvi = (void *)0x0;
  pxVar4->content = (xmlChar *)0x0;
  pxVar4->properties = (_xmlAttr *)0x0;
  pxVar4->doc = (_xmlDoc *)0x0;
  pxVar4->ns = (xmlNs *)0x0;
  pxVar4->next = (_xmlNode *)0x0;
  pxVar4->prev = (_xmlNode *)0x0;
  pxVar4->last = (_xmlNode *)0x0;
  pxVar4->parent = (_xmlNode *)0x0;
  pxVar4->name = (xmlChar *)0x0;
  pxVar4->children = (_xmlNode *)0x0;
  pxVar4->_private = (void *)0x0;
  *(undefined8 *)&pxVar4->type = 0;
  pxVar4->line = 0;
  pxVar4->extra = 0;
  *(undefined4 *)&pxVar4->field_0x74 = 0;
  pxVar4->type = node->type;
  pxVar4->doc = doc;
  pxVar4->parent = parent;
  pxVar9 = node->name;
  pxVar5 = "text";
  if (((pxVar9 == "text") || (pxVar5 = "textnoenc", pxVar9 == "textnoenc")) ||
     (pxVar5 = "comment", pxVar9 == "comment")) {
LAB_001855e2:
    pxVar4->name = pxVar5;
  }
  else if (pxVar9 != (xmlChar *)0x0) {
    if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
      pxVar5 = xmlStrdup(pxVar9);
    }
    else {
      pxVar5 = xmlDictLookup(doc->dict,pxVar9,-1);
    }
    goto LAB_001855e2;
  }
  xVar1 = node->type;
  if (xVar1 != XML_ELEMENT_NODE) {
    if ((node->content != (xmlChar *)0x0) &&
       ((XML_XINCLUDE_END < xVar1 ||
        ((0x180020U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)))) {
      pxVar9 = xmlStrdup(node->content);
      pxVar4->content = pxVar9;
      goto LAB_0018561e;
    }
    if (xVar1 != XML_ELEMENT_NODE) goto LAB_0018561e;
  }
  pxVar4->line = node->line;
LAB_0018561e:
  if (parent != (xmlNodePtr)0x0) {
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var6 = __xmlRegisterNodeDefaultValue(), *pp_Var6 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var6 = __xmlRegisterNodeDefaultValue();
      (**pp_Var6)(pxVar4);
    }
    unaff_R13 = xmlAddChild(parent,pxVar4);
    if (unaff_R13 != pxVar4) {
      return unaff_R13;
    }
  }
  if (extended != 0) {
    if (((node->type == XML_XINCLUDE_START) || (node->type == XML_ELEMENT_NODE)) &&
       (node->nsDef != (xmlNsPtr)0x0)) {
      pxVar7 = xmlCopyNamespaceList(node->nsDef);
      pxVar4->nsDef = pxVar7;
    }
    if (node->ns != (xmlNs *)0x0) {
      pxVar8 = xmlSearchNs(doc,pxVar4,node->ns->prefix);
      if (pxVar8 == (xmlNsPtr)0x0) {
        pxVar7 = xmlSearchNs(node->doc,node,node->ns->prefix);
        p_Var16 = pxVar4;
        if (pxVar7 == (xmlNsPtr)0x0) {
          pxVar8 = xmlNewReconciledNs(doc,pxVar4,node->ns);
        }
        else {
          do {
            pxVar15 = p_Var16;
            p_Var16 = pxVar15->parent;
          } while (p_Var16 != (_xmlNode *)0x0);
          pxVar8 = xmlNewNs(pxVar15,pxVar7->href,pxVar7->prefix);
        }
      }
      pxVar4->ns = pxVar8;
    }
    if (((node->type == XML_XINCLUDE_START) || (node->type == XML_ELEMENT_NODE)) &&
       (node->properties != (xmlAttrPtr)0x0)) {
      pxVar10 = xmlCopyPropList(pxVar4,node->properties);
      pxVar4->properties = pxVar10;
    }
    if (node->type == XML_ENTITY_REF_NODE) {
      if ((doc == (xmlDocPtr)0x0) || (node->doc != doc)) {
        pxVar11 = xmlGetDocEntity(doc,pxVar4->name);
      }
      else {
        pxVar11 = (xmlEntityPtr)node->children;
      }
      pxVar4->children = (_xmlNode *)pxVar11;
      pxVar4->last = (_xmlNode *)pxVar11;
    }
    else {
      pxVar15 = node->children;
      parent_00 = pxVar4;
      if (extended != 2 && pxVar15 != (_xmlNode *)0x0) {
        do {
          pxVar12 = xmlStaticCopyNode(pxVar15,doc,parent_00,2);
          if (pxVar12 == (xmlNodePtr)0x0) {
            xmlFreeNode(pxVar4);
            iVar13 = 1;
            unaff_R13 = (xmlNodePtr)0x0;
            pxVar12 = parent_00;
            p_Var16 = pxVar15;
          }
          else {
            pxVar2 = parent_00->last;
            if (pxVar2 != pxVar12) {
              if (pxVar2 == (xmlNodePtr)0x0) {
                pp_Var14 = &parent_00->children;
              }
              else {
                pxVar12->prev = pxVar2;
                pp_Var14 = &pxVar2->next;
              }
              *pp_Var14 = pxVar12;
              parent_00->last = pxVar12;
            }
            if (pxVar15->type != XML_ENTITY_REF_NODE) {
              p_Var16 = pxVar15->children;
              iVar13 = 6;
              if (p_Var16 != (_xmlNode *)0x0) goto LAB_001857f5;
            }
            do {
              if (pxVar15->next != (_xmlNode *)0x0) {
                iVar13 = 0;
                pxVar12 = parent_00;
                p_Var16 = pxVar15->next;
                goto LAB_001857f5;
              }
              pxVar15 = pxVar15->parent;
              parent_00 = parent_00->parent;
            } while (pxVar15 != node);
            iVar13 = 0;
            pxVar12 = parent_00;
            p_Var16 = (_xmlNode *)0x0;
          }
LAB_001857f5:
          if ((iVar13 != 6) && (iVar13 != 0)) goto LAB_00185809;
          parent_00 = pxVar12;
          pxVar15 = p_Var16;
        } while (p_Var16 != (_xmlNode *)0x0);
        iVar13 = 0;
LAB_00185809:
        if (iVar13 != 0) {
          return unaff_R13;
        }
      }
    }
  }
  if (parent != (xmlNodePtr)0x0) {
    return pxVar4;
  }
  if (__xmlRegisterCallbacks == 0) {
    return pxVar4;
  }
  pp_Var6 = __xmlRegisterNodeDefaultValue();
  if (*pp_Var6 == (xmlRegisterNodeFunc)0x0) {
    return pxVar4;
  }
  pp_Var6 = __xmlRegisterNodeDefaultValue();
  (**pp_Var6)(pxVar4);
  return pxVar4;
}

Assistant:

xmlNodePtr
xmlStaticCopyNode(xmlNodePtr node, xmlDocPtr doc, xmlNodePtr parent,
                  int extended) {
    xmlNodePtr ret;

    if (node == NULL) return(NULL);
    switch (node->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ELEMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    break;
        case XML_ATTRIBUTE_NODE:
		return((xmlNodePtr) xmlCopyPropInternal(doc, parent, (xmlAttrPtr) node));
        case XML_NAMESPACE_DECL:
	    return((xmlNodePtr) xmlCopyNamespaceList((xmlNsPtr) node));

        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_TREE_ENABLED
	    return((xmlNodePtr) xmlCopyDoc((xmlDocPtr) node, extended));
#endif /* LIBXML_TREE_ENABLED */
        case XML_DOCUMENT_TYPE_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
            return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    ret = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (ret == NULL) {
	xmlTreeErrMemory("copying node");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlNode));
    ret->type = node->type;

    ret->doc = doc;
    ret->parent = parent;
    if (node->name == xmlStringText)
	ret->name = xmlStringText;
    else if (node->name == xmlStringTextNoenc)
	ret->name = xmlStringTextNoenc;
    else if (node->name == xmlStringComment)
	ret->name = xmlStringComment;
    else if (node->name != NULL) {
        if ((doc != NULL) && (doc->dict != NULL))
	    ret->name = xmlDictLookup(doc->dict, node->name, -1);
	else
	    ret->name = xmlStrdup(node->name);
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->content != NULL) &&
	(node->type != XML_ENTITY_REF_NODE) &&
	(node->type != XML_XINCLUDE_END) &&
	(node->type != XML_XINCLUDE_START)) {
	ret->content = xmlStrdup(node->content);
    }else{
      if (node->type == XML_ELEMENT_NODE)
        ret->line = node->line;
    }
    if (parent != NULL) {
	xmlNodePtr tmp;

	/*
	 * this is a tricky part for the node register thing:
	 * in case ret does get coalesced in xmlAddChild
	 * the deregister-node callback is called; so we register ret now already
	 */
	if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	    xmlRegisterNodeDefaultValue((xmlNodePtr)ret);

        /*
         * Note that since ret->parent is already set, xmlAddChild will
         * return early and not actually insert the node. It will only
         * coalesce text nodes and unnecessarily call xmlSetTreeDoc.
         * Assuming that the subtree to be copied always has its text
         * nodes coalesced, the somewhat confusing call to xmlAddChild
         * could be removed.
         */
        tmp = xmlAddChild(parent, ret);
	/* node could have coalesced */
	if (tmp != ret)
	    return(tmp);
    }

    if (!extended)
	goto out;
    if (((node->type == XML_ELEMENT_NODE) ||
         (node->type == XML_XINCLUDE_START)) && (node->nsDef != NULL))
        ret->nsDef = xmlCopyNamespaceList(node->nsDef);

    if (node->ns != NULL) {
        xmlNsPtr ns;

	ns = xmlSearchNs(doc, ret, node->ns->prefix);
	if (ns == NULL) {
	    /*
	     * Humm, we are copying an element whose namespace is defined
	     * out of the new tree scope. Search it in the original tree
	     * and add it at the top of the new tree
	     */
	    ns = xmlSearchNs(node->doc, node, node->ns->prefix);
	    if (ns != NULL) {
	        xmlNodePtr root = ret;

		while (root->parent != NULL) root = root->parent;
		ret->ns = xmlNewNs(root, ns->href, ns->prefix);
		} else {
			ret->ns = xmlNewReconciledNs(doc, ret, node->ns);
	    }
	} else {
	    /*
	     * reference the existing namespace definition in our own tree.
	     */
	    ret->ns = ns;
	}
    }
    if (((node->type == XML_ELEMENT_NODE) ||
         (node->type == XML_XINCLUDE_START)) && (node->properties != NULL))
        ret->properties = xmlCopyPropList(ret, node->properties);
    if (node->type == XML_ENTITY_REF_NODE) {
	if ((doc == NULL) || (node->doc != doc)) {
	    /*
	     * The copied node will go into a separate document, so
	     * to avoid dangling references to the ENTITY_DECL node
	     * we cannot keep the reference. Try to find it in the
	     * target document.
	     */
	    ret->children = (xmlNodePtr) xmlGetDocEntity(doc, ret->name);
	} else {
            ret->children = node->children;
	}
	ret->last = ret->children;
    } else if ((node->children != NULL) && (extended != 2)) {
        xmlNodePtr cur, insert;

        cur = node->children;
        insert = ret;
        while (cur != NULL) {
            xmlNodePtr copy = xmlStaticCopyNode(cur, doc, insert, 2);
            if (copy == NULL) {
                xmlFreeNode(ret);
                return(NULL);
            }

            /* Check for coalesced text nodes */
            if (insert->last != copy) {
                if (insert->last == NULL) {
                    insert->children = copy;
                } else {
                    copy->prev = insert->last;
                    insert->last->next = copy;
                }
                insert->last = copy;
            }

            if ((cur->type != XML_ENTITY_REF_NODE) &&
                (cur->children != NULL)) {
                cur = cur->children;
                insert = copy;
                continue;
            }

            while (1) {
                if (cur->next != NULL) {
                    cur = cur->next;
                    break;
                }

                cur = cur->parent;
                insert = insert->parent;
                if (cur == node) {
                    cur = NULL;
                    break;
                }
            }
        }
    }

out:
    /* if parent != NULL we already registered the node above */
    if ((parent == NULL) &&
        ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue)))
	xmlRegisterNodeDefaultValue((xmlNodePtr)ret);
    return(ret);
}